

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool duckdb_re2::re2_internal::Parse<double>(char *str,size_t n,double *dest)

{
  char *__nptr;
  int *piVar1;
  double *in_RDX;
  long in_RSI;
  double dVar2;
  double r;
  char *end;
  char buf [201];
  char *local_100;
  bool in_stack_ffffffffffffff0f;
  size_t *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    __nptr = TerminateNumber(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff0f);
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar2 = strtod(__nptr,&local_100);
    if (local_100 == __nptr + in_RSI) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (in_RDX == (double *)0x0) {
          local_1 = true;
        }
        else {
          *in_RDX = dVar2;
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Parse(const char* str, size_t n, double* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r = strtod(str, &end);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}